

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::operator+=(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *right)

{
  undefined1 local_40 [8];
  Privkey key;
  ByteData256 *right_local;
  Privkey *this_local;
  
  key._24_8_ = right;
  CreateTweakAdd((Privkey *)local_40,this,right);
  operator=(this,(Privkey *)local_40);
  Privkey(__return_storage_ptr__,this);
  ~Privkey((Privkey *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::operator+=(const ByteData256 &right) {
  Privkey key = CreateTweakAdd(right);
  *this = key;
  return *this;
}